

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.h
# Opt level: O0

void __thiscall soplex::SPxSteepPR<double>::~SPxSteepPR(SPxSteepPR<double> *this)

{
  SPxSteepPR<double> *in_RDI;
  
  ~SPxSteepPR(in_RDI);
  operator_delete(in_RDI,0x158);
  return;
}

Assistant:

virtual ~SPxSteepPR()
   {}